

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  reference pvVar3;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  bool bVar4;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  undefined1 *_elemsize;
  allocator_type *in_stack_ffffffffffffed40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  size_t in_stack_ffffffffffffed48;
  int _elempack;
  void **ppvVar5;
  undefined4 in_stack_ffffffffffffed50;
  int in_stack_ffffffffffffed54;
  int in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  undefined4 in_stack_ffffffffffffed60;
  int in_stack_ffffffffffffed64;
  Mat *in_stack_ffffffffffffed68;
  undefined7 in_stack_ffffffffffffed70;
  undefined1 in_stack_ffffffffffffed77;
  int in_stack_ffffffffffffedb0;
  Mat *pMVar6;
  Allocator *in_stack_ffffffffffffedb8;
  Allocator *in_stack_ffffffffffffedc0;
  int *in_stack_ffffffffffffee20;
  undefined4 in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee2c;
  int *in_stack_ffffffffffffee30;
  undefined7 in_stack_ffffffffffffee38;
  undefined1 in_stack_ffffffffffffee3f;
  Mat *in_stack_ffffffffffffee40;
  undefined7 in_stack_ffffffffffffee48;
  undefined1 in_stack_ffffffffffffee4f;
  int *in_stack_ffffffffffffee90;
  int *in_stack_ffffffffffffee98;
  int *in_stack_ffffffffffffeea0;
  int *in_stack_ffffffffffffeea8;
  int *in_stack_ffffffffffffeed0;
  int *in_stack_ffffffffffffeed8;
  int *in_stack_ffffffffffffeee0;
  int *in_stack_ffffffffffffeee8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffeef0;
  undefined7 in_stack_ffffffffffffeef8;
  undefined1 in_stack_ffffffffffffeeff;
  int *in_stack_ffffffffffffef10;
  undefined7 in_stack_ffffffffffffef18;
  undefined1 in_stack_ffffffffffffef1f;
  int *in_stack_ffffffffffffef20;
  undefined7 in_stack_ffffffffffffef28;
  undefined1 in_stack_ffffffffffffef2f;
  void *local_f60;
  int *local_f58;
  size_t local_f50;
  int local_f48;
  Allocator *local_f40;
  int local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  int local_f28;
  size_t local_f20;
  undefined8 local_f18;
  undefined8 local_f10;
  undefined8 local_f08;
  undefined4 local_f00;
  Allocator *local_ef8;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined8 local_ed8;
  Mat local_ed0;
  undefined8 local_e88;
  undefined8 local_e80;
  undefined8 local_e78;
  undefined4 local_e70;
  Allocator *local_e68;
  undefined4 local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined4 local_e54;
  undefined4 local_e50;
  undefined8 local_e48;
  Mat local_e40;
  int local_df8;
  int local_df4;
  Mat local_df0;
  void *local_da8;
  int *local_da0;
  ulong local_d98;
  int local_d90;
  Allocator *local_d88;
  int local_d80;
  int local_d7c;
  int local_d78;
  uint local_d74;
  int local_d70;
  ulong local_d68;
  long local_d60;
  int local_d54;
  Mat local_d50;
  Mat local_d08;
  int local_cc0;
  undefined4 local_cbc;
  void *local_cb8;
  int *local_cb0;
  size_t local_ca8;
  Option *in_stack_fffffffffffff360;
  Mat *in_stack_fffffffffffff368;
  Mat *in_stack_fffffffffffff370;
  Crop *in_stack_fffffffffffff378;
  void *local_c70;
  int *local_c68;
  ulong local_c60;
  int local_c58;
  Allocator *local_c50;
  int local_c48;
  int local_c44;
  int local_c40;
  uint local_c3c;
  int local_c38;
  ulong local_c30;
  long local_c28;
  int local_c1c;
  long local_c18;
  int local_c0c;
  long local_c08;
  int local_bfc;
  void *local_bf8;
  int *local_bf0;
  undefined8 local_be8;
  undefined4 local_be0;
  long *local_bd8;
  undefined4 local_bd0;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  ulong local_bb8;
  value_type local_bb0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_b50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_b34;
  int local_b1c;
  int local_b18;
  int local_b14;
  size_t local_b10;
  int local_b04;
  int local_b00;
  int local_afc;
  int local_af8;
  int local_af4;
  long local_af0;
  Mat *local_ae8;
  Mat *local_ae0;
  int local_acc;
  Mat *local_ac8;
  void **local_ac0;
  Mat *local_ab8;
  value_type *local_ab0;
  int local_aa8;
  undefined4 local_aa4;
  Mat *local_aa0;
  Mat *local_a98;
  int local_a88;
  undefined4 local_a84;
  Mat *local_a80;
  Mat *local_a78;
  int local_a68;
  undefined4 local_a64;
  Mat *local_a60;
  Mat *local_a58;
  int local_a48;
  undefined4 local_a44;
  Mat *local_a40;
  Mat *local_a38;
  int local_a28;
  undefined4 local_a24;
  Mat *local_a20;
  Mat *local_a18;
  int local_a08;
  undefined4 local_a04;
  Mat *local_a00;
  Mat *local_9f8;
  int local_9e8;
  undefined4 local_9e4;
  reference local_9e0;
  reference local_9d8;
  reference local_9d0;
  value_type *local_9c8;
  void **local_9b8;
  void **local_9a8;
  Mat *local_998;
  Mat *local_988;
  void **local_978;
  Mat *local_968;
  undefined8 *local_958;
  undefined8 *local_948;
  Mat *local_938;
  Mat *local_928;
  void **local_918;
  void **local_908;
  void **local_8f8;
  Mat *local_8f0;
  Mat *local_8e8;
  Mat *local_8e0;
  Mat *local_8d8;
  Mat *local_8d0;
  Mat *local_8c8;
  undefined1 local_8b9;
  int local_8b8;
  int local_8b4;
  void **local_8a8;
  undefined1 local_891;
  int local_890;
  int local_88c;
  void **local_880;
  undefined1 local_86d;
  int local_86c;
  void **local_868;
  undefined8 *local_860;
  undefined1 local_84d;
  int local_84c;
  void **local_848;
  Mat *local_840;
  undefined1 local_82d;
  int local_82c;
  undefined8 *local_820;
  undefined1 local_80d;
  int local_80c;
  Mat *local_800;
  int local_7ec;
  undefined8 *local_7e8;
  Mat *local_7e0;
  int local_7d4;
  undefined8 *local_7d0;
  Mat *local_7c8;
  Mat *local_7c0;
  void **local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  int local_794;
  value_type *local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  int local_76c;
  void **local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined8 local_750;
  int local_748;
  int local_744;
  value_type *local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined8 local_728;
  int local_720;
  int local_71c;
  void **local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 local_700;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  value_type *local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  void **local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  value_type *local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  void **local_658;
  value_type *local_650;
  void **local_648;
  undefined4 local_63c;
  long local_638;
  undefined4 local_62c;
  long local_628;
  undefined4 local_61c;
  long local_618;
  undefined4 local_60c;
  long local_608;
  int local_590;
  undefined4 local_58c;
  void **local_588;
  int local_570;
  undefined4 local_56c;
  void **local_568;
  int local_550;
  undefined4 local_54c;
  Mat *local_548;
  int local_530;
  undefined4 local_52c;
  Mat *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  Mat *local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  void **local_4a8;
  int local_490;
  undefined4 local_48c;
  Mat *local_488;
  int local_470;
  undefined4 local_46c;
  Mat *local_468;
  int local_450;
  undefined4 local_44c;
  void **local_448;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  int local_410;
  undefined4 local_40c;
  value_type *local_408;
  int local_400;
  undefined4 local_3fc;
  reference local_3f8;
  int local_3f0;
  undefined4 local_3ec;
  Mat *local_3e8;
  int local_3e0;
  undefined4 local_3dc;
  Mat *local_3d8;
  int local_3d0;
  undefined4 local_3cc;
  Mat *local_3c8;
  int local_3c0;
  undefined4 local_3bc;
  Mat *local_3b8;
  int local_3b0;
  undefined4 local_3ac;
  Mat *local_3a8;
  int local_3a0;
  undefined4 local_39c;
  Mat *local_398;
  void *local_390;
  void *local_388;
  void *local_380;
  void *local_378;
  void *local_370;
  void *local_368;
  void *local_360;
  void *local_358;
  void *local_348;
  void *local_328;
  void *local_318;
  void *local_308;
  void *local_2c8;
  void *local_2b8;
  void *local_2a8;
  void *local_298;
  Mat *local_258;
  Mat *local_250;
  Mat *local_248;
  Mat *local_240;
  Mat *local_238;
  Mat *local_230;
  void **local_228;
  Allocator *local_220;
  int local_214;
  ulong local_210;
  void *local_208;
  int local_200;
  uint local_1fc;
  int local_1f8;
  int local_1f4;
  void **local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  Allocator *local_1d8;
  int local_1cc;
  ulong local_1c8;
  void *local_1c0;
  int local_1b8;
  uint local_1b4;
  int local_1b0;
  int local_1ac;
  void **local_1a8;
  undefined4 local_19c;
  long local_198;
  Allocator *local_190;
  int local_184;
  ulong local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  Mat *local_160;
  undefined4 local_154;
  long local_150;
  Allocator *local_148;
  int local_13c;
  size_t local_138;
  void *local_130;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  long local_108;
  Allocator *local_100;
  int local_f4;
  ulong local_f0;
  void *local_e8;
  uint local_dc;
  int local_d8;
  int local_d4;
  Mat *local_d0;
  undefined4 local_c4;
  long local_c0;
  Allocator *local_b8;
  int local_ac;
  ulong local_a8;
  void *local_a0;
  uint local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  Allocator *local_70;
  int local_64;
  size_t local_60;
  void *local_58;
  int local_50;
  int local_4c;
  Mat *local_48;
  Allocator *local_40;
  int local_34;
  ulong local_30;
  void *local_28;
  int local_20;
  int local_1c;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_af4 = in_RSI->w;
  local_af8 = in_RSI->h;
  local_afc = in_RSI->d;
  local_b00 = in_RSI->c;
  local_b04 = in_RSI->dims;
  local_b10 = in_RSI->elemsize;
  local_b14 = in_RSI->elempack;
  local_af0 = in_RCX;
  local_ae8 = in_RDX;
  local_ae0 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x97e89c);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
               in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x97e8c5);
    local_ab0 = &local_bb0;
    local_ab8 = local_ae0;
    if (local_ae0->dims == 1) {
      local_794 = local_ae0->w * local_ae0->elempack;
      local_790 = &local_bb0;
      local_7a0 = 0;
      local_7a8 = 4;
      local_7b0 = 0;
      local_bb0.elemsize = 4;
      local_bb0.elempack = 1;
      local_bb0.dims = 1;
      local_bb0.h = 1;
      local_bb0.d = 1;
      local_bb0.c = 1;
      local_bb0.cstep = (size_t)local_794;
      local_bb0.w = local_794;
    }
    else if (local_ae0->dims == 2) {
      local_744 = local_ae0->w;
      local_748 = local_ae0->h * local_ae0->elempack;
      local_740 = &local_bb0;
      local_750 = 0;
      local_758 = 4;
      local_760 = 0;
      local_bb0.elemsize = 4;
      local_bb0.elempack = 1;
      local_bb0.dims = 2;
      local_bb0.d = 1;
      local_bb0.c = 1;
      local_bb0.cstep = (long)local_744 * (long)local_748;
      local_bb0.w = local_744;
      local_bb0.h = local_748;
    }
    else if (local_ae0->dims == 3) {
      local_6ec = local_ae0->w;
      local_6f0 = local_ae0->h;
      local_6f4 = local_ae0->c * local_ae0->elempack;
      local_6e8 = &local_bb0;
      local_700 = 0;
      local_708 = 4;
      local_710 = 0;
      local_bb0.elemsize = 4;
      local_bb0.elempack = 1;
      local_bb0.dims = 3;
      local_bb0.d = 1;
      local_608 = (long)local_6ec * (long)local_6f0 * 4;
      local_60c = 0x10;
      local_bb0.cstep = (local_608 + 0xfU & 0xfffffffffffffff0) / 4;
      local_bb0.w = local_6ec;
      local_bb0.h = local_6f0;
      local_bb0.c = local_6f4;
    }
    else if (local_ae0->dims == 4) {
      local_68c = local_ae0->w;
      local_690 = local_ae0->h;
      local_694 = local_ae0->d;
      local_698 = local_ae0->c * local_ae0->elempack;
      local_688 = &local_bb0;
      local_6a0 = 0;
      local_6a8 = 4;
      local_6b0 = 0;
      local_bb0.elemsize = 4;
      local_bb0.elempack = 1;
      local_bb0.dims = 4;
      local_628 = (long)local_68c * (long)local_690 * (long)local_694 * 4;
      local_62c = 0x10;
      local_bb0.cstep = (local_628 + 0xfU & 0xfffffffffffffff0) / 4;
      local_bb0.w = local_68c;
      local_bb0.h = local_690;
      local_bb0.d = local_694;
      local_bb0.c = local_698;
    }
    else {
      local_650 = &local_bb0;
      local_bb0.elemsize = 0;
      local_bb0.elempack = 0;
      local_bb0.dims = 0;
      local_bb0.w = 0;
      local_bb0.h = 0;
      local_bb0.d = 0;
      local_bb0.c = 0;
      local_bb0.cstep = 0;
    }
    local_bb0.allocator = (Allocator *)0x0;
    local_bb0.refcount = (int *)0x0;
    local_bb0.data = (void *)0x0;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_b50,0);
    local_9e0 = &local_bb0;
    local_9d8 = pvVar3;
    if (pvVar3 != local_9e0) {
      if (local_bb0.refcount != (int *)0x0) {
        local_9e4 = 1;
        LOCK();
        local_9e8 = *local_bb0.refcount;
        *local_bb0.refcount = *local_bb0.refcount + 1;
        UNLOCK();
      }
      local_3f8 = pvVar3;
      if (pvVar3->refcount != (int *)0x0) {
        piVar1 = pvVar3->refcount;
        local_3fc = 0xffffffff;
        LOCK();
        local_400 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_400 == 1) {
          if (pvVar3->allocator == (Allocator *)0x0) {
            local_360 = pvVar3->data;
            if (local_360 != (void *)0x0) {
              free(local_360);
            }
          }
          else {
            (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
          }
        }
      }
      pvVar3->data = (void *)0x0;
      pvVar3->elemsize = 0;
      pvVar3->elempack = 0;
      pvVar3->dims = 0;
      pvVar3->w = 0;
      pvVar3->h = 0;
      pvVar3->d = 0;
      pvVar3->c = 0;
      pvVar3->cstep = 0;
      pvVar3->refcount = (int *)0x0;
      pvVar3->data = local_9e0->data;
      pvVar3->refcount = local_9e0->refcount;
      pvVar3->elemsize = local_9e0->elemsize;
      pvVar3->elempack = local_9e0->elempack;
      pvVar3->allocator = local_9e0->allocator;
      pvVar3->dims = local_9e0->dims;
      pvVar3->w = local_9e0->w;
      pvVar3->h = local_9e0->h;
      pvVar3->d = local_9e0->d;
      pvVar3->c = local_9e0->c;
      pvVar3->cstep = local_9e0->cstep;
    }
    local_9c8 = &local_bb0;
    local_9d0 = pvVar3;
    local_408 = local_9c8;
    if (local_bb0.refcount != (int *)0x0) {
      local_40c = 0xffffffff;
      LOCK();
      local_410 = *local_bb0.refcount;
      *local_bb0.refcount = *local_bb0.refcount + -1;
      UNLOCK();
      if (local_410 == 1) {
        if (local_bb0.allocator == (Allocator *)0x0) {
          local_358 = local_bb0.data;
          if (local_bb0.data != (void *)0x0) {
            free(local_bb0.data);
          }
        }
        else {
          (*(local_bb0.allocator)->_vptr_Allocator[3])(local_bb0.allocator,local_bb0.data);
        }
      }
    }
    local_bb0.data = (void *)0x0;
    local_bb0.elemsize = 0;
    local_bb0.elempack = 0;
    local_bb0.dims = 0;
    local_bb0.w = 0;
    local_bb0.h = 0;
    local_bb0.d = 0;
    local_bb0.c = 0;
    local_bb0.cstep = 0;
    local_bb0.refcount = (int *)0x0;
    this_00 = &local_b34;
    _elemsize = (undefined1 *)
                ((long)&local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start + 4);
    Crop::eval_crop_expr
              ((Crop *)CONCAT17(in_stack_ffffffffffffeeff,in_stack_ffffffffffffeef8),
               in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0,
               in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffef10,
               (int *)CONCAT17(in_stack_ffffffffffffef1f,in_stack_ffffffffffffef18),
               in_stack_ffffffffffffef20,
               (int *)CONCAT17(in_stack_ffffffffffffef2f,in_stack_ffffffffffffef28));
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(this_00);
  }
  else {
    local_ac0 = &local_bf8;
    local_ac8 = local_ae0;
    if (local_ae0->dims == 1) {
      local_76c = local_ae0->w * local_ae0->elempack;
      local_768 = &local_bf8;
      local_778 = 0;
      local_780 = 4;
      local_788 = 0;
      local_be8 = 4;
      local_be0 = 1;
      local_bd0 = 1;
      local_bc8 = 1;
      local_bc4 = 1;
      local_bc0 = 1;
      local_bb8 = (ulong)local_76c;
      local_bcc = local_76c;
    }
    else if (local_ae0->dims == 2) {
      local_71c = local_ae0->w;
      local_720 = local_ae0->h * local_ae0->elempack;
      local_718 = &local_bf8;
      local_728 = 0;
      local_730 = 4;
      local_738 = 0;
      local_be8 = 4;
      local_be0 = 1;
      local_bd0 = 2;
      local_bc4 = 1;
      local_bc0 = 1;
      local_bb8 = (long)local_71c * (long)local_720;
      local_bcc = local_71c;
      local_bc8 = local_720;
    }
    else if (local_ae0->dims == 3) {
      local_6bc = local_ae0->w;
      local_6c0 = local_ae0->h;
      local_6c4 = local_ae0->c * local_ae0->elempack;
      local_6b8 = &local_bf8;
      local_6d0 = 0;
      local_6d8 = 4;
      local_6e0 = 0;
      local_be8 = 4;
      local_be0 = 1;
      local_bd0 = 3;
      local_bc4 = 1;
      local_618 = (long)local_6bc * (long)local_6c0 * 4;
      local_61c = 0x10;
      local_bb8 = (local_618 + 0xfU & 0xfffffffffffffff0) / 4;
      local_bcc = local_6bc;
      local_bc8 = local_6c0;
      local_bc0 = local_6c4;
    }
    else if (local_ae0->dims == 4) {
      local_65c = local_ae0->w;
      local_660 = local_ae0->h;
      local_664 = local_ae0->d;
      local_668 = local_ae0->c * local_ae0->elempack;
      local_658 = &local_bf8;
      local_670 = 0;
      local_678 = 4;
      local_680 = 0;
      local_be8 = 4;
      local_be0 = 1;
      local_bd0 = 4;
      local_638 = (long)local_65c * (long)local_660 * (long)local_664 * 4;
      local_63c = 0x10;
      local_bb8 = (local_638 + 0xfU & 0xfffffffffffffff0) / 4;
      local_bcc = local_65c;
      local_bc8 = local_660;
      local_bc4 = local_664;
      local_bc0 = local_668;
    }
    else {
      local_648 = &local_bf8;
      local_be8 = 0;
      local_be0 = 0;
      local_bd0 = 0;
      local_bcc = 0;
      local_bc8 = 0;
      local_bc4 = 0;
      local_bc0 = 0;
      local_bb8 = 0;
    }
    local_bd8 = (long *)0x0;
    local_bf0 = (int *)0x0;
    local_bf8 = (void *)0x0;
    this_00 = &local_b34;
    _elemsize = (undefined1 *)
                ((long)&local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start + 4);
    Crop::resolve_crop_roi
              ((Crop *)CONCAT17(in_stack_ffffffffffffee4f,in_stack_ffffffffffffee48),
               in_stack_ffffffffffffee40,
               (int *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
               in_stack_ffffffffffffee30,
               (int *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
               in_stack_ffffffffffffee20,in_stack_ffffffffffffee90,in_stack_ffffffffffffee98,
               in_stack_ffffffffffffeea0,in_stack_ffffffffffffeea8);
    local_9b8 = &local_bf8;
    local_428 = local_9b8;
    if (local_bf0 != (int *)0x0) {
      local_42c = 0xffffffff;
      LOCK();
      local_430 = *local_bf0;
      *local_bf0 = *local_bf0 + -1;
      UNLOCK();
      if (local_430 == 1) {
        if (local_bd8 == (long *)0x0) {
          local_348 = local_bf8;
          if (local_bf8 != (void *)0x0) {
            free(local_bf8);
          }
        }
        else {
          (**(code **)(*local_bd8 + 0x18))(local_bd8,local_bf8);
        }
      }
    }
    local_bf8 = (void *)0x0;
    local_be8 = 0;
    local_be0 = 0;
    local_bd0 = 0;
    local_bcc = 0;
    local_bc8 = 0;
    local_bc4 = 0;
    local_bc0 = 0;
    local_bb8 = 0;
    local_bf0 = (int *)0x0;
  }
  if (local_b14 == 4) {
    _elempack = (int)(in_stack_ffffffffffffed48 >> 0x20);
    if (local_b04 == 1) {
      local_bfc = 1;
      if (local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ % 4 == 0) {
        local_bfc = 4;
      }
      local_c08 = (local_b10 / 4) * (long)local_bfc;
      if ((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ / local_bfc == local_af4) && (local_bfc == 4)) {
        local_9f8 = local_ae8;
        local_a00 = local_ae0;
        if (local_ae8 != local_ae0) {
          if (local_ae0->refcount != (int *)0x0) {
            piVar1 = local_ae0->refcount;
            local_a04 = 1;
            LOCK();
            local_a08 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_3e8 = local_ae8;
          if (local_ae8->refcount != (int *)0x0) {
            piVar1 = local_ae8->refcount;
            local_3ec = 0xffffffff;
            LOCK();
            local_3f0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_3f0 == 1) {
              if (local_ae8->allocator == (Allocator *)0x0) {
                local_368 = local_ae8->data;
                if (local_368 != (void *)0x0) {
                  free(local_368);
                }
              }
              else {
                (*local_ae8->allocator->_vptr_Allocator[3])
                          (local_ae8->allocator,local_ae8->data,
                           (long)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_ % (long)local_bfc
                           & 0xffffffff);
              }
            }
          }
          local_ae8->data = (void *)0x0;
          local_ae8->elemsize = 0;
          local_ae8->elempack = 0;
          local_ae8->dims = 0;
          local_ae8->w = 0;
          local_ae8->h = 0;
          local_ae8->d = 0;
          local_ae8->c = 0;
          local_ae8->cstep = 0;
          local_ae8->refcount = (int *)0x0;
          local_ae8->data = local_a00->data;
          local_ae8->refcount = local_a00->refcount;
          local_ae8->elemsize = local_a00->elemsize;
          local_ae8->elempack = local_a00->elempack;
          local_ae8->allocator = local_a00->allocator;
          local_ae8->dims = local_a00->dims;
          local_ae8->w = local_a00->w;
          local_ae8->h = local_a00->h;
          local_ae8->d = local_a00->d;
          local_ae8->c = local_a00->c;
          local_ae8->cstep = local_a00->cstep;
        }
        return 0;
      }
      if ((local_b18 % 4 == 0) && (local_bfc == 4)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                    in_stack_ffffffffffffed5c,
                    CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),_elempack,
                    (Allocator *)this_00);
        local_8c8 = local_ae8;
        bVar4 = true;
        if (local_ae8->data != (void *)0x0) {
          local_258 = local_ae8;
          bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
        }
        if (!bVar4) {
          crop_pack4_sse(local_ae0,local_ae8,0,local_b18 / local_b14);
          return 0;
        }
        return -100;
      }
    }
    if (local_b04 == 2) {
      local_c0c = 1;
      if ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_finish % 4 == 0) {
        local_c0c = 4;
      }
      local_c18 = (local_b10 / 4) * (long)local_c0c;
      if (((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ == local_af4) &&
          ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish / local_c0c == local_af8)) && (local_c0c == 4)) {
        local_a18 = local_ae8;
        local_a20 = local_ae0;
        if (local_ae8 != local_ae0) {
          if (local_ae0->refcount != (int *)0x0) {
            piVar1 = local_ae0->refcount;
            local_a24 = 1;
            LOCK();
            local_a28 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_3d8 = local_ae8;
          if (local_ae8->refcount != (int *)0x0) {
            piVar1 = local_ae8->refcount;
            local_3dc = 0xffffffff;
            LOCK();
            local_3e0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_3e0 == 1) {
              if (local_ae8->allocator == (Allocator *)0x0) {
                local_370 = local_ae8->data;
                if (local_370 != (void *)0x0) {
                  free(local_370);
                }
              }
              else {
                (*local_ae8->allocator->_vptr_Allocator[3])
                          (local_ae8->allocator,local_ae8->data,
                           (long)(int)local_b34.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish % (long)local_c0c &
                           0xffffffff);
              }
            }
          }
          local_ae8->data = (void *)0x0;
          local_ae8->elemsize = 0;
          local_ae8->elempack = 0;
          local_ae8->dims = 0;
          local_ae8->w = 0;
          local_ae8->h = 0;
          local_ae8->d = 0;
          local_ae8->c = 0;
          local_ae8->cstep = 0;
          local_ae8->refcount = (int *)0x0;
          local_ae8->data = local_a20->data;
          local_ae8->refcount = local_a20->refcount;
          local_ae8->elemsize = local_a20->elemsize;
          local_ae8->elempack = local_a20->elempack;
          local_ae8->allocator = local_a20->allocator;
          local_ae8->dims = local_a20->dims;
          local_ae8->w = local_a20->w;
          local_ae8->h = local_a20->h;
          local_ae8->d = local_a20->d;
          local_ae8->c = local_a20->c;
          local_ae8->cstep = local_a20->cstep;
        }
        return 0;
      }
      if ((local_b1c % 4 == 0) && (local_c0c == 4)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                    in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58,
                    CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),_elempack,
                    (Allocator *)this_00);
        local_8d0 = local_ae8;
        bVar4 = true;
        if (local_ae8->data != (void *)0x0) {
          local_250 = local_ae8;
          bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
        }
        if (!bVar4) {
          crop_pack4_sse(local_ae0,local_ae8,local_b1c / local_b14,local_b18);
          return 0;
        }
        return -100;
      }
    }
    if (local_b04 == 3) {
      local_c1c = 1;
      if ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start % 4 == 0) {
        local_c1c = 4;
      }
      local_c28 = (local_b10 / 4) * (long)local_c1c;
      if (((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ == local_af4) &&
          ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish == local_af8)) &&
         (((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start / local_c1c == local_b00 && (local_c1c == 4)))) {
        local_a38 = local_ae8;
        local_a40 = local_ae0;
        if (local_ae8 != local_ae0) {
          if (local_ae0->refcount != (int *)0x0) {
            piVar1 = local_ae0->refcount;
            local_a44 = 1;
            LOCK();
            local_a48 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_3c8 = local_ae8;
          if (local_ae8->refcount != (int *)0x0) {
            piVar1 = local_ae8->refcount;
            local_3cc = 0xffffffff;
            LOCK();
            local_3d0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_3d0 == 1) {
              if (local_ae8->allocator == (Allocator *)0x0) {
                local_378 = local_ae8->data;
                if (local_378 != (void *)0x0) {
                  free(local_378);
                }
              }
              else {
                (*local_ae8->allocator->_vptr_Allocator[3])
                          (local_ae8->allocator,local_ae8->data,
                           (long)(int)local_b34.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start % (long)local_c1c &
                           0xffffffff);
              }
            }
          }
          local_ae8->data = (void *)0x0;
          local_ae8->elemsize = 0;
          local_ae8->elempack = 0;
          local_ae8->dims = 0;
          local_ae8->w = 0;
          local_ae8->h = 0;
          local_ae8->d = 0;
          local_ae8->c = 0;
          local_ae8->cstep = 0;
          local_ae8->refcount = (int *)0x0;
          local_ae8->data = local_a40->data;
          local_ae8->refcount = local_a40->refcount;
          local_ae8->elemsize = local_a40->elemsize;
          local_ae8->elempack = local_a40->elempack;
          local_ae8->allocator = local_a40->allocator;
          local_ae8->dims = local_a40->dims;
          local_ae8->w = local_a40->w;
          local_ae8->h = local_a40->h;
          local_ae8->d = local_a40->d;
          local_ae8->c = local_a40->c;
          local_ae8->cstep = local_a40->cstep;
        }
        return 0;
      }
      if (((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage % 4 == 0) && (local_c1c == 4)) {
        local_88c = (int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage / 4;
        local_890 = (int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_start / 4;
        local_880 = &local_c70;
        local_1f4 = local_ae0->w;
        local_1f8 = local_ae0->h;
        local_1fc = local_ae0->d;
        local_208 = (void *)((long)local_ae0->data +
                            local_ae0->cstep * (long)local_88c * local_ae0->elemsize);
        local_210 = local_ae0->elemsize;
        local_214 = local_ae0->elempack;
        local_220 = local_ae0->allocator;
        local_1f0 = &local_c70;
        local_c68 = (int *)0x0;
        local_1e0 = (long)local_1f4 * (long)local_1f8 * (long)(int)local_1fc * local_210;
        local_c30 = (local_1e0 + 0xfU & 0xfffffffffffffff0) / local_210;
        local_c48 = local_ae0->dims;
        local_1e4 = 0x10;
        local_891 = 1;
        local_200 = local_890;
        local_c70 = local_208;
        local_c60 = local_210;
        local_c58 = local_214;
        local_c50 = local_220;
        local_c44 = local_1f4;
        local_c40 = local_1f8;
        local_c3c = local_1fc;
        local_c38 = local_890;
        if ((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_ == local_af4) &&
           ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_finish == local_af8)) {
          Mat::clone((Mat *)&local_cb8,(__fn *)&local_c70,*(void **)(local_af0 + 8),(int)local_1f0,
                     (void *)(ulong)local_1fc);
          pMVar6 = local_ae8;
          local_a58 = local_ae8;
          local_a60 = (Mat *)&local_cb8;
          if (local_ae8 != local_a60) {
            if (local_cb0 != (int *)0x0) {
              local_a64 = 1;
              LOCK();
              local_a68 = *local_cb0;
              *local_cb0 = *local_cb0 + 1;
              UNLOCK();
            }
            local_3b8 = local_ae8;
            if (local_ae8->refcount != (int *)0x0) {
              piVar1 = local_ae8->refcount;
              local_3bc = 0xffffffff;
              LOCK();
              local_3c0 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_3c0 == 1) {
                if (local_ae8->allocator == (Allocator *)0x0) {
                  local_380 = local_ae8->data;
                  if (local_380 != (void *)0x0) {
                    free(local_380);
                  }
                }
                else {
                  (*local_ae8->allocator->_vptr_Allocator[3])(local_ae8->allocator,local_ae8->data);
                }
              }
            }
            pMVar6->data = (void *)0x0;
            pMVar6->elemsize = 0;
            pMVar6->elempack = 0;
            pMVar6->dims = 0;
            pMVar6->w = 0;
            pMVar6->h = 0;
            pMVar6->d = 0;
            pMVar6->c = 0;
            pMVar6->cstep = 0;
            pMVar6->refcount = (int *)0x0;
            pMVar6->data = local_a60->data;
            pMVar6->refcount = local_a60->refcount;
            pMVar6->elemsize = local_a60->elemsize;
            pMVar6->elempack = local_a60->elempack;
            pMVar6->allocator = local_a60->allocator;
            pMVar6->dims = local_a60->dims;
            pMVar6->w = local_a60->w;
            pMVar6->h = local_a60->h;
            pMVar6->d = local_a60->d;
            pMVar6->c = local_a60->c;
            pMVar6->cstep = local_a60->cstep;
          }
          local_9a8 = &local_cb8;
          local_448 = local_9a8;
          if (local_cb0 != (int *)0x0) {
            local_44c = 0xffffffff;
            LOCK();
            local_450 = *local_cb0;
            *local_cb0 = *local_cb0 + -1;
            UNLOCK();
            if (local_450 == 1) {
              if (in_stack_fffffffffffff368 == (Mat *)0x0) {
                if (local_cb8 != (void *)0x0) {
                  free(local_cb8);
                }
              }
              else {
                (**(code **)((long)in_stack_fffffffffffff368->data + 0x18))
                          (in_stack_fffffffffffff368,local_cb8);
              }
            }
          }
          local_cb8 = (void *)0x0;
          local_ca8 = 0;
          local_cb0 = (int *)0x0;
          local_8d8 = local_ae8;
          bVar4 = true;
          if (local_ae8->data != (void *)0x0) {
            local_248 = local_ae8;
            bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
          }
          if (bVar4) {
            local_acc = -100;
            goto LAB_00981ab8;
          }
        }
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                    in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58,in_stack_ffffffffffffed54,
                    in_stack_ffffffffffffed48,(int)((ulong)this_00 >> 0x20),
                    in_stack_ffffffffffffedc0);
        local_8e0 = local_ae8;
        bVar4 = true;
        if (local_ae8->data != (void *)0x0) {
          local_240 = local_ae8;
          bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
        }
        if (bVar4) {
          local_acc = -100;
        }
        else {
          for (local_cc0 = 0; local_cc0 < local_ae8->c; local_cc0 = local_cc0 + 1) {
            local_840 = &local_d08;
            local_848 = &local_c70;
            local_e8 = (void *)((long)local_c70 + local_c30 * (long)local_cc0 * local_c60);
            local_d0 = &local_d08;
            local_d08.refcount = (int *)0x0;
            local_d08.elemsize = local_c60;
            local_d08.elempack = local_c58;
            local_d08.allocator = local_c50;
            local_d08.w = local_c44;
            local_d08.h = local_c40;
            local_d08.d = 1;
            local_d08.c = local_c3c;
            local_c0 = (long)local_c44 * (long)local_c40 * local_c60;
            local_d08.cstep = (local_c0 + 0xfU & 0xfffffffffffffff0) / local_c60;
            local_d08.dims = local_c48 + -1;
            if (local_c48 == 4) {
              local_d08.cstep = (long)local_c44 * (long)local_c40;
            }
            local_800 = &local_d50;
            local_164 = local_ae8->w;
            local_168 = local_ae8->h;
            local_16c = local_ae8->d;
            local_178 = (void *)((long)local_ae8->data +
                                local_ae8->cstep * (long)local_cc0 * local_ae8->elemsize);
            local_180 = local_ae8->elemsize;
            local_184 = local_ae8->elempack;
            local_190 = local_ae8->allocator;
            local_160 = &local_d50;
            local_d50.refcount = (int *)0x0;
            local_d50.d = 1;
            local_150 = (long)local_164 * (long)local_168 * local_180;
            local_d50.cstep = (local_150 + 0xfU & 0xfffffffffffffff0) / local_180;
            local_d50.dims = local_ae8->dims + -1;
            if (local_ae8->dims == 4) {
              local_d50.cstep = (long)local_ae8->w * (long)local_ae8->h;
            }
            local_c4 = 0x10;
            local_d4 = local_c44;
            local_d8 = local_c40;
            local_dc = local_c3c;
            local_f0 = local_c60;
            local_f4 = local_c58;
            local_100 = local_c50;
            local_154 = 0x10;
            local_80c = local_cc0;
            local_80d = 1;
            local_84c = local_cc0;
            local_84d = 1;
            local_d50.data = local_178;
            local_d50.elemsize = local_180;
            local_d50.elempack = local_184;
            local_d50.allocator = local_190;
            local_d50.w = local_164;
            local_d50.h = local_168;
            local_d50.c = local_16c;
            local_d08.data = local_e8;
            crop_pack4_sse(&local_d08,&local_d50,local_b1c,local_b18);
            local_998 = &local_d50;
            local_468 = local_998;
            if (local_d50.refcount != (int *)0x0) {
              local_46c = 0xffffffff;
              LOCK();
              local_470 = *local_d50.refcount;
              *local_d50.refcount = *local_d50.refcount + -1;
              UNLOCK();
              if (local_470 == 1) {
                if (local_d50.allocator == (Allocator *)0x0) {
                  local_328 = local_d50.data;
                  if (local_d50.data != (void *)0x0) {
                    free(local_d50.data);
                  }
                }
                else {
                  (*(local_d50.allocator)->_vptr_Allocator[3])(local_d50.allocator,local_d50.data);
                }
              }
            }
            local_d50.data = (void *)0x0;
            local_d50.elemsize = 0;
            local_d50.elempack = 0;
            local_d50.dims = 0;
            local_d50.w = 0;
            local_d50.h = 0;
            local_d50.d = 0;
            local_d50.c = 0;
            local_d50.cstep = 0;
            local_d50.refcount = (int *)0x0;
            local_988 = &local_d08;
            local_488 = local_988;
            if (local_d08.refcount != (int *)0x0) {
              local_48c = 0xffffffff;
              LOCK();
              local_490 = *local_d08.refcount;
              *local_d08.refcount = *local_d08.refcount + -1;
              UNLOCK();
              if (local_490 == 1) {
                if (local_d08.allocator == (Allocator *)0x0) {
                  local_318 = local_d08.data;
                  if (local_d08.data != (void *)0x0) {
                    free(local_d08.data);
                  }
                }
                else {
                  (*(local_d08.allocator)->_vptr_Allocator[3])(local_d08.allocator,local_d08.data);
                }
              }
            }
            local_d08.data = (void *)0x0;
            local_d08.elemsize = 0;
            local_d08.elempack = 0;
            local_d08.dims = 0;
            local_d08.w = 0;
            local_d08.h = 0;
            local_d08.d = 0;
            local_d08.c = 0;
            local_d08.cstep = 0;
            local_d08.refcount = (int *)0x0;
          }
          local_acc = 0;
        }
LAB_00981ab8:
        local_cbc = 1;
        ppvVar5 = &local_c70;
        if (local_c68 != (int *)0x0) {
          local_4ac = 0xffffffff;
          LOCK();
          local_4b0 = *local_c68;
          *local_c68 = *local_c68 + -1;
          UNLOCK();
          if (local_4b0 == 1) {
            local_978 = ppvVar5;
            local_4a8 = ppvVar5;
            if (local_c50 == (Allocator *)0x0) {
              local_308 = local_c70;
              if (local_c70 != (void *)0x0) {
                free(local_c70);
              }
            }
            else {
              (*local_c50->_vptr_Allocator[3])(local_c50,local_c70);
            }
          }
        }
        *ppvVar5 = (void *)0x0;
        ppvVar5[2] = (void *)0x0;
        *(undefined4 *)(ppvVar5 + 3) = 0;
        *(undefined4 *)(ppvVar5 + 5) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
        *(undefined4 *)(ppvVar5 + 6) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
        *(undefined4 *)(ppvVar5 + 7) = 0;
        ppvVar5[8] = (void *)0x0;
        ppvVar5[1] = (void *)0x0;
        return local_acc;
      }
    }
    if (local_b04 == 4) {
      local_d54 = 1;
      if ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start % 4 == 0) {
        local_d54 = 4;
      }
      local_d60 = (local_b10 / 4) * (long)local_d54;
      if ((((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_ == local_af4) &&
           ((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_finish == local_af8)) &&
          (local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_ == local_afc)) &&
         (((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start / local_d54 == local_b00 && (local_d54 == 4)))) {
        local_a78 = local_ae8;
        local_a80 = local_ae0;
        if (local_ae8 != local_ae0) {
          if (local_ae0->refcount != (int *)0x0) {
            piVar1 = local_ae0->refcount;
            local_a84 = 1;
            LOCK();
            local_a88 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_3a8 = local_ae8;
          pMVar6 = local_ae8;
          if (local_ae8->refcount != (int *)0x0) {
            piVar1 = local_ae8->refcount;
            local_3ac = 0xffffffff;
            LOCK();
            local_3b0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_3b0 == 1) {
              if (local_ae8->allocator == (Allocator *)0x0) {
                local_388 = local_ae8->data;
                if (local_388 != (void *)0x0) {
                  free(local_388);
                }
              }
              else {
                (*local_ae8->allocator->_vptr_Allocator[3])
                          (local_ae8->allocator,local_ae8->data,
                           (long)(int)local_b34.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start % (long)local_d54 &
                           0xffffffff);
              }
            }
          }
          local_ae8->data = (void *)0x0;
          local_ae8->elemsize = 0;
          local_ae8->elempack = 0;
          local_ae8->dims = 0;
          local_ae8->w = 0;
          local_ae8->h = 0;
          local_ae8->d = 0;
          local_ae8->c = 0;
          local_ae8->cstep = 0;
          local_ae8->refcount = (int *)0x0;
          pMVar6->data = local_a80->data;
          pMVar6->refcount = local_a80->refcount;
          pMVar6->elemsize = local_a80->elemsize;
          pMVar6->elempack = local_a80->elempack;
          pMVar6->allocator = local_a80->allocator;
          pMVar6->dims = local_a80->dims;
          pMVar6->w = local_a80->w;
          pMVar6->h = local_a80->h;
          pMVar6->d = local_a80->d;
          pMVar6->c = local_a80->c;
          pMVar6->cstep = local_a80->cstep;
        }
        return 0;
      }
      if (((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage % 4 == 0) && (local_d54 == 4)) {
        local_8b4 = (int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage / 4;
        local_8b8 = (int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_start / 4;
        local_8a8 = &local_da8;
        local_1ac = local_ae0->w;
        local_1b0 = local_ae0->h;
        local_1b4 = local_ae0->d;
        local_1c0 = (void *)((long)local_ae0->data +
                            local_ae0->cstep * (long)local_8b4 * local_ae0->elemsize);
        local_1c8 = local_ae0->elemsize;
        local_1cc = local_ae0->elempack;
        local_1d8 = local_ae0->allocator;
        local_1a8 = &local_da8;
        local_da0 = (int *)0x0;
        local_198 = (long)local_1ac * (long)local_1b0 * (long)(int)local_1b4 * local_1c8;
        local_d68 = (local_198 + 0xfU & 0xfffffffffffffff0) / local_1c8;
        local_d80 = local_ae0->dims;
        local_19c = 0x10;
        local_8b9 = 1;
        local_1b8 = local_8b8;
        local_da8 = local_1c0;
        local_d98 = local_1c8;
        local_d90 = local_1cc;
        local_d88 = local_1d8;
        local_d7c = local_1ac;
        local_d78 = local_1b0;
        local_d74 = local_1b4;
        local_d70 = local_8b8;
        if ((local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_ == local_af4) &&
           (((int)local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish == local_af8 &&
            (local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_ == local_afc)))) {
          Mat::clone(&local_df0,(__fn *)&local_da8,*(void **)(local_af0 + 8),(int)local_1a8,
                     (void *)(ulong)local_1b4);
          pMVar6 = local_ae8;
          local_a98 = local_ae8;
          local_aa0 = &local_df0;
          if (local_ae8 != local_aa0) {
            if (local_df0.refcount != (int *)0x0) {
              local_aa4 = 1;
              LOCK();
              local_aa8 = *local_df0.refcount;
              *local_df0.refcount = *local_df0.refcount + 1;
              UNLOCK();
            }
            local_398 = local_ae8;
            if (local_ae8->refcount != (int *)0x0) {
              piVar1 = local_ae8->refcount;
              local_39c = 0xffffffff;
              LOCK();
              local_3a0 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_3a0 == 1) {
                if (local_ae8->allocator == (Allocator *)0x0) {
                  local_390 = local_ae8->data;
                  if (local_390 != (void *)0x0) {
                    free(local_390);
                  }
                }
                else {
                  (*local_ae8->allocator->_vptr_Allocator[3])(local_ae8->allocator,local_ae8->data);
                }
              }
            }
            pMVar6->data = (void *)0x0;
            pMVar6->elemsize = 0;
            pMVar6->elempack = 0;
            pMVar6->dims = 0;
            pMVar6->w = 0;
            pMVar6->h = 0;
            pMVar6->d = 0;
            pMVar6->c = 0;
            pMVar6->cstep = 0;
            pMVar6->refcount = (int *)0x0;
            pMVar6->data = local_aa0->data;
            pMVar6->refcount = local_aa0->refcount;
            pMVar6->elemsize = local_aa0->elemsize;
            pMVar6->elempack = local_aa0->elempack;
            pMVar6->allocator = local_aa0->allocator;
            pMVar6->dims = local_aa0->dims;
            pMVar6->w = local_aa0->w;
            pMVar6->h = local_aa0->h;
            pMVar6->d = local_aa0->d;
            pMVar6->c = local_aa0->c;
            pMVar6->cstep = local_aa0->cstep;
          }
          local_968 = &local_df0;
          local_4c8 = local_968;
          if (local_df0.refcount != (int *)0x0) {
            local_4cc = 0xffffffff;
            LOCK();
            local_4d0 = *local_df0.refcount;
            *local_df0.refcount = *local_df0.refcount + -1;
            UNLOCK();
            if (local_4d0 == 1) {
              if (local_df0.allocator == (Allocator *)0x0) {
                if (local_df0.data != (void *)0x0) {
                  free(local_df0.data);
                }
              }
              else {
                (*(local_df0.allocator)->_vptr_Allocator[3])(local_df0.allocator,local_df0.data);
              }
            }
          }
          local_df0.data = (void *)0x0;
          local_df0.elemsize = 0;
          local_df0.elempack = 0;
          local_df0.dims = 0;
          local_df0.w = 0;
          local_df0.h = 0;
          local_df0.d = 0;
          local_df0.c = 0;
          local_df0.cstep = 0;
          local_df0.refcount = (int *)0x0;
          local_8e8 = local_ae8;
          bVar4 = true;
          if (local_ae8->data != (void *)0x0) {
            local_238 = local_ae8;
            bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
          }
          if (bVar4) {
            local_acc = -100;
            goto LAB_009839dc;
          }
        }
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                    (int)(in_stack_ffffffffffffed48 >> 0x20),(int)in_stack_ffffffffffffed48,
                    (int)((ulong)this_00 >> 0x20),(int)this_00,(size_t)_elemsize,
                    in_stack_ffffffffffffedb0,in_stack_ffffffffffffedb8);
        local_8f0 = local_ae8;
        bVar4 = true;
        if (local_ae8->data != (void *)0x0) {
          local_230 = local_ae8;
          bVar4 = local_ae8->cstep * (long)local_ae8->c == 0;
        }
        if (bVar4) {
          local_acc = -100;
        }
        else {
          for (local_df4 = 0; local_df4 < local_ae8->c; local_df4 = local_df4 + 1) {
            for (local_df8 = 0;
                local_df8 <
                local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_; local_df8 = local_df8 + 1) {
              local_860 = &local_e88;
              local_868 = &local_da8;
              local_a0 = (void *)((long)local_da8 + local_d68 * (long)local_df4 * local_d98);
              local_88 = &local_e88;
              local_78 = (long)local_d7c * (long)local_d78 * local_d98;
              local_7ec = local_df8 +
                          local_b34.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              local_7e0 = &local_e40;
              local_7e8 = &local_e88;
              local_28 = (void *)((long)local_a0 +
                                 (long)local_d7c * (long)local_d78 * (long)local_7ec * local_d98);
              local_18 = &local_e40;
              local_e40.cstep = (long)local_d7c * (long)local_d78;
              local_958 = &local_e88;
              local_820 = &local_f18;
              local_11c = local_ae8->w;
              local_120 = local_ae8->h;
              local_124 = local_ae8->d;
              local_130 = (void *)((long)local_ae8->data +
                                  local_ae8->cstep * (long)local_df4 * local_ae8->elemsize);
              local_138 = local_ae8->elemsize;
              local_13c = local_ae8->elempack;
              local_148 = local_ae8->allocator;
              local_118 = &local_f18;
              local_108 = (long)local_11c * (long)local_120 * local_138;
              local_7c8 = &local_ed0;
              local_7d0 = &local_f18;
              local_58 = (void *)((long)local_130 +
                                 (long)local_11c * (long)local_120 * (long)local_df8 * local_138);
              local_48 = &local_ed0;
              local_ed0.cstep = (long)local_11c * (long)local_120;
              local_948 = &local_f18;
              local_e40.c = 1;
              local_e40.d = 1;
              local_e40.h = local_d78;
              local_e40.w = local_d7c;
              local_e40.dims = 2;
              local_e40.allocator = local_d88;
              local_e40.elempack = local_d90;
              local_e40.elemsize = local_d98;
              local_e40.refcount = (int *)0x0;
              local_e50 = 0;
              local_e54 = 0;
              local_e58 = 0;
              local_e5c = 0;
              local_e68 = local_d88;
              local_e70 = 0;
              local_e78 = 0;
              local_e80 = 0;
              local_e88 = 0;
              local_ed0.c = 1;
              local_ed0.d = 1;
              local_ed0.dims = 2;
              local_ed0.refcount = (int *)0x0;
              local_1c = local_d7c;
              local_20 = local_d78;
              local_30 = local_d98;
              local_34 = local_d90;
              local_40 = local_d88;
              local_7c = 0x10;
              local_8c = local_d7c;
              local_90 = local_d78;
              local_94 = local_d74;
              local_a8 = local_d98;
              local_ac = local_d90;
              local_b8 = local_d88;
              local_10c = 0x10;
              local_7d4 = local_df8;
              local_82c = local_df4;
              local_82d = 1;
              local_86c = local_df4;
              local_86d = 1;
              local_e48 = 0;
              local_e60 = 0;
              local_f18 = 0;
              local_f08 = 0;
              local_f00 = 0;
              local_ef0 = 0;
              local_eec = 0;
              local_ee8 = 0;
              local_ee4 = 0;
              local_ee0 = 0;
              local_ed8 = 0;
              local_f10 = 0;
              local_508 = local_948;
              local_4e8 = local_958;
              local_70 = local_148;
              local_64 = local_13c;
              local_60 = local_138;
              local_50 = local_120;
              local_4c = local_11c;
              local_ef8 = local_148;
              local_ed0.data = local_58;
              local_ed0.elemsize = local_138;
              local_ed0.elempack = local_13c;
              local_ed0.allocator = local_148;
              local_ed0.w = local_11c;
              local_ed0.h = local_120;
              local_e40.data = local_28;
              crop_pack4_sse(&local_e40,&local_ed0,local_b1c,local_b18);
              pMVar6 = &local_ed0;
              local_938 = pMVar6;
              local_528 = pMVar6;
              if (local_ed0.refcount != (int *)0x0) {
                local_52c = 0xffffffff;
                LOCK();
                local_530 = *local_ed0.refcount;
                *local_ed0.refcount = *local_ed0.refcount + -1;
                UNLOCK();
                if (local_530 == 1) {
                  if (local_ed0.allocator == (Allocator *)0x0) {
                    local_2c8 = local_ed0.data;
                    if (local_ed0.data != (void *)0x0) {
                      free(local_ed0.data);
                    }
                  }
                  else {
                    (*(local_ed0.allocator)->_vptr_Allocator[3])(local_ed0.allocator,local_ed0.data)
                    ;
                  }
                }
              }
              pMVar6->data = (void *)0x0;
              pMVar6->elemsize = 0;
              pMVar6->elempack = 0;
              pMVar6->dims = 0;
              pMVar6->w = 0;
              pMVar6->h = 0;
              pMVar6->d = 0;
              pMVar6->c = 0;
              pMVar6->cstep = 0;
              pMVar6->refcount = (int *)0x0;
              local_928 = &local_e40;
              local_548 = local_928;
              if (local_e40.refcount != (int *)0x0) {
                local_54c = 0xffffffff;
                LOCK();
                local_550 = *local_e40.refcount;
                *local_e40.refcount = *local_e40.refcount + -1;
                UNLOCK();
                if (local_550 == 1) {
                  if (local_e40.allocator == (Allocator *)0x0) {
                    local_2b8 = local_e40.data;
                    if (local_e40.data != (void *)0x0) {
                      free(local_e40.data);
                    }
                  }
                  else {
                    (*(local_e40.allocator)->_vptr_Allocator[3])(local_e40.allocator,local_e40.data)
                    ;
                  }
                }
              }
              local_e40.data = (void *)0x0;
              local_e40.elemsize = 0;
              local_e40.elempack = 0;
              local_e40.dims = 0;
              local_e40.w = 0;
              local_e40.h = 0;
              local_e40.d = 0;
              local_e40.c = 0;
              local_e40.cstep = 0;
              local_e40.refcount = (int *)0x0;
            }
          }
          local_acc = 0;
        }
LAB_009839dc:
        local_cbc = 1;
        local_918 = &local_da8;
        if (local_da0 == (int *)0x0) {
          return local_acc;
        }
        local_56c = 0xffffffff;
        LOCK();
        local_570 = *local_da0;
        *local_da0 = *local_da0 + -1;
        UNLOCK();
        if (local_570 != 1) {
          return local_acc;
        }
        local_568 = local_918;
        if (local_d88 != (Allocator *)0x0) {
          (*local_d88->_vptr_Allocator[3])(local_d88,local_da8);
          return local_acc;
        }
        local_2a8 = local_da8;
        if (local_da8 == (void *)0x0) {
          return local_acc;
        }
        free(local_da8);
        return local_acc;
      }
    }
  }
  local_7b8 = &local_f60;
  local_7c0 = local_ae0;
  local_f60 = local_ae0->data;
  local_f58 = local_ae0->refcount;
  local_f50 = local_ae0->elemsize;
  local_f48 = local_ae0->elempack;
  local_f40 = local_ae0->allocator;
  local_f38 = local_ae0->dims;
  local_f34 = local_ae0->w;
  local_f30 = local_ae0->h;
  local_f2c = local_ae0->d;
  local_f28 = local_ae0->c;
  local_f20 = local_ae0->cstep;
  if (local_f58 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_f58;
    *local_f58 = *local_f58 + 1;
    UNLOCK();
  }
  local_8 = local_7b8;
  if (local_b14 != 1) {
    convert_packing((Mat *)CONCAT17(in_stack_ffffffffffffed77,in_stack_ffffffffffffed70),
                    in_stack_ffffffffffffed68,in_stack_ffffffffffffed64,
                    (Option *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    local_8f8 = &local_f60;
    if (local_f60 != (void *)0x0) {
      local_228 = local_8f8;
    }
    if (local_f60 == (void *)0x0 || local_f20 * (long)local_f28 == 0) {
      local_acc = -100;
      goto LAB_00983f8c;
    }
  }
  local_acc = Crop::forward(in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                            in_stack_fffffffffffff368,in_stack_fffffffffffff360);
LAB_00983f8c:
  local_cbc = 1;
  ppvVar5 = &local_f60;
  if (local_f58 != (int *)0x0) {
    local_58c = 0xffffffff;
    LOCK();
    local_590 = *local_f58;
    *local_f58 = *local_f58 + -1;
    UNLOCK();
    if (local_590 == 1) {
      local_908 = ppvVar5;
      local_588 = ppvVar5;
      if (local_f40 == (Allocator *)0x0) {
        local_298 = local_f60;
        if (local_f60 != (void *)0x0) {
          free(local_f60);
        }
      }
      else {
        (*local_f40->_vptr_Allocator[3])(local_f40,local_f60);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return local_acc;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}